

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Parser::ParseLoop(Parser *this)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar2;
  pointer pSVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  byte bVar7;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  String name;
  undefined1 local_88 [40];
  String local_60;
  SymbolType local_40 [4];
  
  paVar2 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar2;
  if (((this->m_error == false) &&
      (pSVar3 = (this->m_currentSymbol)._M_current,
      pSVar3 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar3->type == NameValue)) {
    local_40[0] = From;
    local_40[1] = Over;
    local_40[2] = Until;
    local_40[3] = While;
    symbols._M_len = 4;
    symbols._M_array = local_40;
    ParseMultiName_abi_cxx11_((String *)local_88,this,symbols);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (&local_60,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_88);
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      MemFree((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    bVar6 = VariableStackFrame::VariableExists(&this->m_variableStackFrame,&local_60);
    if (bVar6) {
      local_88._0_8_ = local_60._M_dataplus._M_p;
      Error<char_const*>(this,"Variable name \'%s\' already exists in this scope",(char **)local_88)
      ;
      goto LAB_002052a8;
    }
  }
  if (this->m_error == false) {
    pSVar3 = (this->m_currentSymbol)._M_current;
    if ((pSVar3 == (this->m_symbolList->
                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                   _M_impl.super__Vector_impl_data._M_finish) || (pSVar3->type != From)) {
      pSVar3 = (this->m_currentSymbol)._M_current;
      if ((pSVar3 == (this->m_symbolList->
                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                     _M_impl.super__Vector_impl_data._M_finish) || (pSVar3->type != Over)) {
        pSVar3 = (this->m_currentSymbol)._M_current;
        if (((pSVar3 == (this->m_symbolList->
                        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                        )._M_impl.super__Vector_impl_data._M_finish) || (pSVar3->type != Until)) &&
           ((pSVar3 = (this->m_currentSymbol)._M_current,
            pSVar3 == (this->m_symbolList->
                      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                      _M_impl.super__Vector_impl_data._M_finish || (pSVar3->type != While)))) {
          pSVar3 = (this->m_currentSymbol)._M_current;
          if ((pSVar3 == (this->m_symbolList->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) || (pSVar3->type != NewLine))
          goto LAB_00205299;
          this->m_lastLine = pSVar3->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar3 + 1;
          sVar5 = (this->m_writer).m_pos;
          ParseBlock(this);
          if ((this->m_error == false) &&
             ((pSVar3 = (this->m_currentSymbol)._M_current,
              pSVar3 != (this->m_symbolList->
                        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                        )._M_impl.super__Vector_impl_data._M_finish && (pSVar3->type == While)))) {
            this->m_lastLine = pSVar3->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar3 + 1;
            bVar7 = 1;
          }
          else {
            bVar7 = 0;
          }
          if (bVar7 == 0) {
            Expect(this,Until,(char *)0x0);
          }
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          Expect(this,NewLine,(char *)0x0);
          EmitOpcode(this,(uint)bVar7 * 2 + JumpFalse);
          local_88._0_4_ = (int)sVar5;
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &(this->m_writer).m_pos,local_88,4);
        }
        else {
          pSVar3 = (this->m_currentSymbol)._M_current;
          if ((pSVar3 == (this->m_symbolList->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) || (pSVar3->type != Until)) {
            bVar7 = 0;
          }
          else {
            this->m_lastLine = pSVar3->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar3 + 1;
            bVar7 = 1;
          }
          sVar5 = (this->m_writer).m_pos;
          if (bVar7 == 0) {
            Expect(this,While,(char *)0x0);
          }
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          bVar6 = Expect(this,NewLine,(char *)0x0);
          if (!bVar6) goto LAB_002052a8;
          EmitOpcode(this,(uint)bVar7 * 2 + JumpFalse);
          psVar1 = &(this->m_writer).m_pos;
          sVar4 = (this->m_writer).m_pos;
          local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                        local_88,4);
          ParseBlock(this);
          Expect(this,End,(char *)0x0);
          Expect(this,NewLine,(char *)0x0);
          EmitOpcode(this,Jump);
          local_88._0_4_ = (ValueType)sVar5;
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                        local_88,4);
          sVar5 = (this->m_writer).m_pos;
          (this->m_writer).m_pos = sVar4;
          local_88._0_4_ = (int)sVar5;
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                        local_88,4);
          *psVar1 = sVar5;
          if (!bVar6) goto LAB_002052a8;
        }
      }
      else {
        this->m_lastLine = pSVar3->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar3 + 1;
        ScopeBegin(this);
        ParseExpression(this,(this->m_symbolList->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        bVar6 = Expect(this,NewLine,(char *)0x0);
        if (!bVar6) goto LAB_002052a8;
        EmitOpcode(this,PushTop);
        EmitOpcode(this,JumpFalse);
        psVar1 = &(this->m_writer).m_pos;
        sVar5 = (this->m_writer).m_pos;
        local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                      local_88,4);
        EmitOpcode(this,PushItr);
        if (local_60._M_string_length != 0) {
          VariableAssign(this,&local_60);
          EmitOpcode(this,SetVar);
          local_88._0_8_ = VariableNameToRuntimeID(this,&local_60);
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                        local_88,8);
        }
        sVar4 = (this->m_writer).m_pos;
        ParseBlock(this);
        Expect(this,End,(char *)0x0);
        Expect(this,NewLine,(char *)0x0);
        EmitOpcode(this,LoopOver);
        EmitOpcode(this,JumpFalse);
        local_88._0_4_ = (ValueType)sVar4;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                      local_88,4);
        sVar4 = (this->m_writer).m_pos;
        (this->m_writer).m_pos = sVar5;
        local_88._0_4_ = (int)sVar4;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar1,
                      local_88,4);
        (this->m_writer).m_pos = sVar4;
        ScopeEnd(this);
      }
    }
    else {
      this->m_lastLine = pSVar3->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar3 + 1;
      ScopeBegin(this);
      ParseExpression(this,(this->m_symbolList->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      if (local_60._M_string_length != 0) {
        VariableAssign(this,&local_60);
        EmitOpcode(this,SetVar);
        local_88._0_8_ = VariableNameToRuntimeID(this,&local_60);
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &(this->m_writer).m_pos,local_88,8);
      }
      Expect(this,To,(char *)0x0);
      ParseExpression(this,(this->m_symbolList->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      if (((this->m_error == false) &&
          (pSVar3 = (this->m_currentSymbol)._M_current,
          pSVar3 != (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish)) && (pSVar3->type == By)) {
        this->m_lastLine = pSVar3->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar3 + 1;
        ParseExpression(this,(this->m_symbolList->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        EmitOpcode(this,PushVal);
        local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
        Variant::SetNull((Variant *)local_88);
        Variant::Write((Variant *)local_88,&this->m_writer);
        Variant::~Variant((Variant *)local_88);
      }
      Expect(this,NewLine,(char *)0x0);
      sVar5 = (this->m_writer).m_pos;
      ParseBlock(this);
      Expect(this,End,(char *)0x0);
      Expect(this,NewLine,(char *)0x0);
      EmitOpcode(this,LoopCount);
      EmitOpcode(this,JumpTrue);
      local_88._0_4_ = (int)sVar5;
      Buffer::Write((this->m_writer).m_buffer.
                    super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    &(this->m_writer).m_pos,local_88,4);
      ScopeEnd(this);
    }
    if (this->m_breakAddress != 0) {
      sVar5 = (this->m_writer).m_pos;
      (this->m_writer).m_pos = this->m_breakAddress;
      local_88._0_4_ = (int)sVar5;
      Buffer::Write((this->m_writer).m_buffer.
                    super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    &(this->m_writer).m_pos,local_88,4);
      (this->m_writer).m_pos = sVar5;
      this->m_breakAddress = 0;
    }
  }
  else {
LAB_00205299:
    Error<>(this,"Unknown syntax after loop keyword");
  }
LAB_002052a8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    MemFree(local_60._M_dataplus._M_p,
            CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0])
            + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ParseLoop()
	{
		// Check to see if we're using an explicitly named variable for the loop counter
		String name;
		if (CheckName())
		{
			// Parse initial name part
			name = ParseMultiName({ SymbolType::From, SymbolType::Over, SymbolType::Until, SymbolType::While });

			// Make sure the variable name doesn't already exist
			if (VariableExists(name))
			{
				Error("Variable name '%s' already exists in this scope", name.c_str());
				return;
			}
		}

		// We're looping using a counter
		if (Accept(SymbolType::From))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse from value
			ParseExpression();

			// Assign the counter to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Parse to value
			Expect(SymbolType::To);
			ParseExpression();

			// Parse increment amount
			if (Accept(SymbolType::By))
			{
				ParseExpression();
			}
			else
			{
				EmitOpcode(Opcode::PushVal);
				EmitValue(nullptr);
			}
			Expect(SymbolType::NewLine);

			// Mark where the loop count evaluation has to jump
			auto loopBeginAddress = m_writer.Tell();

			// Evaluate code block inside loop
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Advance counter and evaluate
			EmitOpcode(Opcode::LoopCount);

			// Evaluate result of loop count instruction
			EmitOpcode(Opcode::JumpTrue);
			EmitAddress(loopBeginAddress);

			// End loop scope
			ScopeEnd();
		}
		// We're looping over a collection
		else if (Accept(SymbolType::Over))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse the collection
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Check to see if the collection is empty, and if so, skip the loop
			EmitOpcode(Opcode::PushTop);
			EmitOpcode(Opcode::JumpFalse);
			auto emptyLoopJumpAddress = EmitAddressPlaceholder();

			// Retrieve collection from top of stack and push iterator from beginning position
			EmitOpcode(Opcode::PushItr);

			// Assign the iterator to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Increment iterator and test against collection end
			EmitOpcode(Opcode::LoopOver);
			EmitOpcode(Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);

			// Backfill empty loop jump address
			EmitAddressBackfill(emptyLoopJumpAddress);

			// End loop scope
			ScopeEnd();

		}
		// Loops while a condition is true or false
		else if (Check(SymbolType::Until) || Check(SymbolType::While))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Check for keyword
			bool jumpTrue = Accept(SymbolType::Until);
			if (!jumpTrue)
				Expect(SymbolType::While);

			// Parse the expression to control the loop's jump branch
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Add jump instruction, making sure to store the jump address for later backfilling
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			auto loopJumpAddress = EmitAddressPlaceholder();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Jump to top of loop
			EmitOpcode(Opcode::Jump);
			EmitAddress(loopBeginAddress);

			// Backfill loop jump target address
			EmitAddressBackfill(loopJumpAddress);
		}
		// Executes once and then loops again while a condition is true/false, depending on keyword used
		else if (Accept(SymbolType::NewLine))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the until/while loop block
			ParseBlock();

			// Check the keyword is used
			bool jumpTrue = Accept(SymbolType::While);
			if (!jumpTrue)
				Expect(SymbolType::Until);

			// Parse expression used to determine if loop should execute again
			ParseExpression();
			Expect(SymbolType::NewLine);

			// Conditionally jump to top of loop
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);
		}
		else
		{
			Error("Unknown syntax after loop keyword");
			return;
		}

		// If we used a break somewhere inside the loop, backfill the address now
		if (m_breakAddress)
		{
			EmitAddressBackfill(m_breakAddress);
			m_breakAddress = 0;
		}
	}